

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

opj_bool jp2_read_pclr_v2(opj_jp2_v2_t *jp2,uchar *p_pclr_header_data,OPJ_UINT32 p_pclr_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  uint *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  opj_jp2_pclr_t *poVar6;
  uint uVar7;
  OPJ_BYTE *p_buffer;
  ulong uVar8;
  ulong __size;
  OPJ_UINT32 l_value;
  uchar *local_40;
  OPJ_UINT32 local_34;
  
  if ((jp2->color).jp2_pclr != (opj_jp2_pclr_t *)0x0) {
    return 0;
  }
  opj_read_bytes_LE(p_pclr_header_data,&l_value,2);
  OVar1 = l_value;
  local_34 = l_value;
  uVar7 = l_value & 0xffff;
  opj_read_bytes_LE(p_pclr_header_data + 2,&l_value,1);
  OVar2 = l_value;
  local_40 = p_pclr_header_data + 3;
  __size = (ulong)(l_value & 0xffff);
  puVar3 = (uint *)malloc((ulong)((l_value & 0xffff) * uVar7) << 2);
  puVar4 = (uchar *)malloc(__size);
  puVar5 = (uchar *)malloc(__size);
  poVar6 = (opj_jp2_pclr_t *)malloc(0x28);
  poVar6->channel_sign = puVar5;
  poVar6->channel_size = puVar4;
  poVar6->entries = puVar3;
  poVar6->nr_entries = (unsigned_short)OVar1;
  poVar6->nr_channels = (unsigned_short)OVar2;
  poVar6->cmap = (opj_jp2_cmap_comp_t *)0x0;
  (jp2->color).jp2_pclr = poVar6;
  for (uVar8 = 0; p_buffer = local_40 + uVar8, __size != uVar8; uVar8 = uVar8 + 1) {
    opj_read_bytes_LE(p_buffer,&l_value,1);
    puVar4[uVar8] = ((byte)l_value & 0x7f) + 1;
    puVar5[uVar8] = (byte)l_value >> 7;
  }
  for (local_40 = (uchar *)0x0; (ushort)local_40 < (ushort)local_34;
      local_40 = (uchar *)(ulong)((int)local_40 + 1)) {
    for (uVar8 = 0; __size != uVar8; uVar8 = uVar8 + 1) {
      opj_read_bytes_LE(p_buffer,&l_value,(uint)(puVar4[uVar8] >> 3));
      p_buffer = p_buffer + (puVar4[uVar8] >> 3);
      *puVar3 = l_value;
      puVar3 = puVar3 + 1;
    }
  }
  return 1;
}

Assistant:

opj_bool jp2_read_pclr_v2(	opj_jp2_v2_t *jp2,
							unsigned char * p_pclr_header_data,
							OPJ_UINT32 p_pclr_header_size,
							opj_event_mgr_t * p_manager
						  ){
	opj_jp2_pclr_t *jp2_pclr;
	OPJ_BYTE *channel_size, *channel_sign;
	OPJ_UINT32 *entries;
	OPJ_UINT16 nr_entries,nr_channels;
	OPJ_UINT16 i, j;
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(p_pclr_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	if(jp2->color.jp2_pclr)
		return OPJ_FALSE;

	opj_read_bytes(p_pclr_header_data, &l_value , 2);	/* NE */
	p_pclr_header_data += 2;
	nr_entries = (OPJ_UINT16) l_value;

	opj_read_bytes(p_pclr_header_data, &l_value , 1);	/* NPC */
	++p_pclr_header_data;
	nr_channels = (OPJ_UINT16) l_value;

	entries = (OPJ_UINT32*) opj_malloc(nr_channels * nr_entries * sizeof(OPJ_UINT32));
	channel_size = (OPJ_BYTE*) opj_malloc(nr_channels);
	channel_sign = (OPJ_BYTE*) opj_malloc(nr_channels);

	jp2_pclr = (opj_jp2_pclr_t*)opj_malloc(sizeof(opj_jp2_pclr_t));
	jp2_pclr->channel_sign = channel_sign;
	jp2_pclr->channel_size = channel_size;
	jp2_pclr->entries = entries;
	jp2_pclr->nr_entries = nr_entries;
	jp2_pclr->nr_channels = nr_channels;
	jp2_pclr->cmap = NULL;

	jp2->color.jp2_pclr = jp2_pclr;

	for(i = 0; i < nr_channels; ++i) {
		opj_read_bytes(p_pclr_header_data, &l_value , 1);	/* Bi */
		++p_pclr_header_data;

		channel_size[i] = (l_value & 0x7f) + 1;
		channel_sign[i] = (l_value & 0x80)? 1 : 0;
	}

	for(j = 0; j < nr_entries; ++j) {
		for(i = 0; i < nr_channels; ++i) {
			/**entries++ = cio_read(cio, channel_size[i]>>3); */
			opj_read_bytes(p_pclr_header_data, &l_value , channel_size[i]>>3);	/* Cji */
			p_pclr_header_data += channel_size[i]>>3;
			*entries = (OPJ_UINT32) l_value;
			entries++;
		}
	}

	return OPJ_TRUE;
}